

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_wstring.cpp
# Opt level: O3

void __thiscall ON_wString::CopyArray(ON_wString *this)

{
  ON_Internal_Empty_wString *memblock;
  wchar_t *s;
  ON_Internal_Empty_wString *pOVar1;
  
  s = this->m_s;
  memblock = (ON_Internal_Empty_wString *)(s + -3);
  if ((memblock != &empty_wstring && s != (wchar_t *)0x0) &&
     (L'\x01' < (memblock->header).ref_count.super___atomic_base<int>._M_i)) {
    this->m_s = (wchar_t *)0x83417c;
    CopyToArray(this,s[-1],s);
    if (s[-2] < s[-1]) {
      pOVar1 = (ON_Internal_Empty_wString *)(this->m_s + -3);
      if (this->m_s == (wchar_t *)0x0) {
        pOVar1 = &empty_wstring;
      }
      (pOVar1->header).string_length = s[-2];
    }
    LOCK();
    (memblock->header).ref_count.super___atomic_base<int>._M_i =
         (memblock->header).ref_count.super___atomic_base<int>._M_i + L'\xffffffff';
    UNLOCK();
    if ((memblock->header).ref_count.super___atomic_base<int>._M_i == L'\0') {
      s[-2] = L'\0';
      s[-1] = L'\0';
      onfree(memblock);
      return;
    }
  }
  return;
}

Assistant:

ON_wStringHeader* ON_wString::Header() const
{
  ON_wStringHeader* hdr = (ON_wStringHeader*)m_s;
  if (hdr)
    hdr--;
  else
    hdr = &empty_wstring.header;
  return hdr;
}